

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_resources(CompilerMSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  ExecutionModel EVar3;
  char *local_30;
  char *per_primitive;
  char *topology;
  SPIREntryPoint *execution;
  CompilerMSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  declare_constant_arrays(this);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id);
  emit_interface_block(this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_out_var_id);
  emit_interface_block(this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
  emit_interface_block(this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_in_var_id);
  emit_interface_block(this,uVar2);
  EVar3 = Compiler::get_execution_model((Compiler *)this);
  if (EVar3 == ExecutionModelMeshEXT) {
    topology = (char *)Compiler::get_entry_point((Compiler *)this);
    per_primitive = "";
    bVar1 = Bitset::get(&((SPIREntryPoint *)topology)->flags,0x14b2);
    if (bVar1) {
      per_primitive = "topology::triangle";
    }
    else {
      bVar1 = Bitset::get((Bitset *)(topology + 0x80),0x1495);
      if (bVar1) {
        per_primitive = "topology::line";
      }
      else {
        bVar1 = Bitset::get((Bitset *)(topology + 0x80),0x1b);
        if (bVar1) {
          per_primitive = "topology::point";
        }
      }
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->mesh_out_per_primitive);
    local_30 = "void";
    if (uVar2 != 0) {
      local_30 = "spvPerPrimitive";
    }
    CompilerGLSL::
    statement<char_const(&)[24],char_const(&)[15],char_const*&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],char_const*&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [24])"using spvMesh_t = mesh<",
               (char (*) [15])"spvPerVertex, ",&local_30,(char (*) [3])0x421228,
               (uint *)(topology + 0xe0),(char (*) [3])0x421228,(uint *)(topology + 0xe4),
               (char (*) [3])0x421228,&per_primitive,(char (*) [3])">;");
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  }
  return;
}

Assistant:

void CompilerMSL::emit_resources()
{
	declare_constant_arrays();

	// Emit the special [[stage_in]] and [[stage_out]] interface blocks which we created.
	emit_interface_block(stage_out_var_id);
	emit_interface_block(patch_stage_out_var_id);
	emit_interface_block(stage_in_var_id);
	emit_interface_block(patch_stage_in_var_id);

	if (get_execution_model() == ExecutionModelMeshEXT)
	{
		auto &execution = get_entry_point();
		const char *topology = "";
		if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
			topology = "topology::triangle";
		else if (execution.flags.get(ExecutionModeOutputLinesEXT))
			topology = "topology::line";
		else if (execution.flags.get(ExecutionModeOutputPoints))
			topology = "topology::point";

		const char *per_primitive = mesh_out_per_primitive ? "spvPerPrimitive" : "void";
		statement("using spvMesh_t = mesh<", "spvPerVertex, ", per_primitive, ", ", execution.output_vertices, ", ",
		          execution.output_primitives, ", ", topology, ">;");
		statement("");
	}
}